

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O1

void __thiscall PrintfTest_VPrintf_Test::TestBody(PrintfTest_VPrintf_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long_long uVar2;
  FILE *pFVar3;
  bool bVar4;
  int iVar5;
  AssertionResult *pAVar6;
  char *pcVar7;
  undefined8 uVar8;
  ulong uVar9;
  AssertionResult gtest_ar;
  string gtest_expected_output;
  OutputRedirect gtest_redir;
  string gtest_output;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
  as;
  AssertionResult local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  OutputRedirect local_2a8;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_298;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  char local_240 [504];
  undefined8 local_48 [3];
  
  uVar2 = fmt::v5::
          format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
          ::TYPES;
  local_48[0] = 0x2a;
  aStack_250._M_allocated_capacity = 0;
  local_260._0_8_ = &PTR_grow_00240f40;
  aStack_250._8_8_ = 500;
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = "%d";
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = 2;
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_260;
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_298.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_48;
  local_260._8_8_ = local_240;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_298);
  paVar1 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,local_260._8_8_,
             (char *)(local_260._8_8_ + aStack_250._M_allocated_capacity));
  local_260._0_8_ = &PTR_grow_00240f40;
  if ((char *)local_260._8_8_ != local_240) {
    operator_delete((void *)local_260._8_8_);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_2d8,"fmt::vsprintf(\"%d\", args)","\"42\"",&local_2c8,
             (char (*) [3])0x207c47);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if (local_2d8.success_ == false) {
    testing::Message::Message((Message *)local_260);
    if (local_2d8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x205,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2d8.success_ == true) {
    local_2c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"42","");
    OutputRedirect::OutputRedirect(&local_2a8,(FILE *)_stdout);
    bVar4 = testing::internal::AlwaysTrue();
    pFVar3 = _stdout;
    if (bVar4) {
      aStack_250._M_allocated_capacity = 0;
      local_260._0_8_ = &PTR_grow_00240f40;
      aStack_250._8_8_ = 500;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%d";
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 2;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_260;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ = uVar2;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_48;
      local_260._8_8_ = local_240;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_298);
      fwrite((void *)local_260._8_8_,1,aStack_250._M_allocated_capacity,pFVar3);
      local_260._0_8_ = &PTR_grow_00240f40;
      if ((char *)local_260._8_8_ != local_240) {
        operator_delete((void *)local_260._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_260,&local_2a8);
    if (local_260._8_8_ == local_2c8._M_string_length) {
      bVar4 = true;
      if ((char *)local_260._8_8_ != (char *)0x0) {
        iVar5 = bcmp((void *)local_260._0_8_,local_2c8._M_dataplus._M_p,local_260._8_8_);
        if (iVar5 != 0) goto LAB_0012d7f5;
      }
    }
    else {
LAB_0012d7f5:
      pAVar6 = testing::AssertionResult::operator<<
                         (&local_2d8,
                          (char (*) [53])"fmt::vprintf(\"%d\", args) produces different output.\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x20d845);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_2c8);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x20df0f);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x20d839);
      testing::AssertionResult::operator<<
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_260);
      bVar4 = false;
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_);
    }
    OutputRedirect::~OutputRedirect(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (!bVar4) goto LAB_0012d884;
  }
  else {
LAB_0012d884:
    testing::Message::Message((Message *)local_260);
    if (local_2d8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x206,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2d8.success_ == true) {
    local_2c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"42","");
    OutputRedirect::OutputRedirect(&local_2a8,(FILE *)_stdout);
    bVar4 = testing::internal::AlwaysTrue();
    pFVar3 = _stdout;
    if (bVar4) {
      aStack_250._M_allocated_capacity = 0;
      local_260._0_8_ = &PTR_grow_00240f40;
      aStack_250._8_8_ = 500;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%d";
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 2;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_260;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ = uVar2;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_48;
      local_260._8_8_ = local_240;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_298);
      fwrite((void *)local_260._8_8_,1,aStack_250._M_allocated_capacity,pFVar3);
      local_260._0_8_ = &PTR_grow_00240f40;
      if ((char *)local_260._8_8_ != local_240) {
        operator_delete((void *)local_260._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_260,&local_2a8);
    if (local_260._8_8_ == local_2c8._M_string_length) {
      bVar4 = true;
      if ((char *)local_260._8_8_ != (char *)0x0) {
        iVar5 = bcmp((void *)local_260._0_8_,local_2c8._M_dataplus._M_p,local_260._8_8_);
        if (iVar5 != 0) goto LAB_0012da32;
      }
    }
    else {
LAB_0012da32:
      pAVar6 = testing::AssertionResult::operator<<
                         (&local_2d8,
                          (char (*) [62])
                          "fmt::vfprintf(stdout, \"%d\", args) produces different output.\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x20d845);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_2c8);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x20df0f);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x20d839);
      testing::AssertionResult::operator<<
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_260);
      bVar4 = false;
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_);
    }
    OutputRedirect::~OutputRedirect(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (!bVar4) goto LAB_0012dac1;
  }
  else {
LAB_0012dac1:
    testing::Message::Message((Message *)local_260);
    if (local_2d8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x207,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
      }
      local_260._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2d8.success_ == true) {
    local_2c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"42","");
    OutputRedirect::OutputRedirect(&local_2a8,(FILE *)_stdout);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      aStack_250._M_allocated_capacity = 0;
      local_260._0_8_ = &PTR_grow_00240f40;
      aStack_250._8_8_ = 500;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%d";
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 2;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_260;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ = uVar2;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_298.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_48;
      local_260._8_8_ = local_240;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_298);
      pcVar7 = (char *)local_260._8_8_;
      uVar8 = aStack_250._M_allocated_capacity;
      do {
        uVar9 = 0x7fffffffffffffff;
        if ((ulong)uVar8 < 0x7fffffffffffffff) {
          uVar9 = uVar8;
        }
        std::ostream::write((char *)&std::cout,(long)pcVar7);
        pcVar7 = pcVar7 + uVar9;
        uVar8 = uVar8 - uVar9;
      } while (uVar8 != 0);
      local_260._0_8_ = &PTR_grow_00240f40;
      if ((char *)local_260._8_8_ != local_240) {
        operator_delete((void *)local_260._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_260,&local_2a8);
    if (local_260._8_8_ == local_2c8._M_string_length) {
      bVar4 = true;
      if ((char *)local_260._8_8_ != (char *)0x0) {
        iVar5 = bcmp((void *)local_260._0_8_,local_2c8._M_dataplus._M_p,local_260._8_8_);
        if (iVar5 != 0) goto LAB_0012dc9c;
      }
    }
    else {
LAB_0012dc9c:
      pAVar6 = testing::AssertionResult::operator<<
                         (&local_2d8,
                          (char (*) [65])
                          "fmt::vfprintf(std::cout, \"%d\", args) produces different output.\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x20d845);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_2c8);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x20df0f);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x20d839);
      testing::AssertionResult::operator<<
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_260);
      bVar4 = false;
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_);
    }
    OutputRedirect::~OutputRedirect(&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (bVar4) goto LAB_0012ddae;
  }
  testing::Message::Message((Message *)local_260);
  if (local_2d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = ((local_2d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_298,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x208,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)local_260);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_260._0_8_ + 8))();
    }
    local_260._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
  }
LAB_0012ddae:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(PrintfTest, VPrintf) {
  fmt::format_arg_store<fmt::printf_context, int> as{42};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(fmt::vsprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(stdout, "%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(std::cout, "%d", args), "42");
}